

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_reselect(_glist *x)

{
  t_gobj *ptVar1;
  int indx;
  int nobjwas;
  t_gobj *gwas;
  t_gobj *g;
  _glist *x_local;
  
  if (x->gl_editor->e_textedfor == (_rtext *)0x0) {
    if ((x->gl_editor->e_selection != (t_selection *)0x0) &&
       (x->gl_editor->e_selection->sel_next == (_selection *)0x0)) {
      gobj_activate(x->gl_editor->e_selection->sel_what,x,1);
    }
  }
  else {
    ptVar1 = x->gl_editor->e_selection->sel_what;
    if ((ptVar1 != (t_gobj *)0x0) && (x->gl_editor->e_selection->sel_next == (_selection *)0x0)) {
      glist_getindex(x,(t_gobj *)0x0);
      canvas_getindex(x,x->gl_editor->e_selection->sel_what);
      glist_noselect(x);
      for (gwas = x->gl_list; gwas != (t_gobj *)0x0; gwas = gwas->g_next) {
        if (gwas == ptVar1) {
          glist_select(x,gwas);
          return;
        }
      }
      for (gwas = x->gl_list; gwas != (t_gobj *)0x0; gwas = gwas->g_next) {
        if (gwas->g_next == (_gobj *)0x0) {
          glist_select(x,gwas);
        }
      }
    }
  }
  return;
}

Assistant:

static void canvas_reselect(t_canvas *x)
{
    t_gobj *g, *gwas;
        /* if someone is text editing, and if only one object is
           selected,  deselect everyone and reselect.  */
    if (x->gl_editor->e_textedfor)
    {
            /* only do this if exactly one item is selected. */
        if ((gwas = x->gl_editor->e_selection->sel_what) &&
            !x->gl_editor->e_selection->sel_next)
        {
            int nobjwas = glist_getindex(x, 0),
                indx = canvas_getindex(x, x->gl_editor->e_selection->sel_what);
            glist_noselect(x);
            for (g = x->gl_list; g; g = g->g_next)
                if (g == gwas)
                {
                    glist_select(x, g);
                    return;
                }
                /* "gwas" must have disappeared; just search to the last
                   object and select it */
            for (g = x->gl_list; g; g = g->g_next)
                if (!g->g_next)
                    glist_select(x, g);
        }
    }
    else if (x->gl_editor->e_selection &&
             !x->gl_editor->e_selection->sel_next)
            /* otherwise activate first item in selection */
        gobj_activate(x->gl_editor->e_selection->sel_what, x, 1);
}